

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestClock::expectUnchanged(TestClock *this,FsNode *file)

{
  DebugComparison<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>,_kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_&>
  _kjCondition;
  DebugComparison<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>,_kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_&>
  local_68;
  undefined1 local_40 [24];
  Quantity<long,_kj::_::NanosecondLabel> local_28;
  
  (*file->_vptr_FsNode[2])(local_40);
  local_68.right = &this->time;
  local_68.result = local_28.value != (this->time).value.value;
  local_68.left.value.value =
       (Quantity<long,_kj::_::NanosecondLabel>)
       (Quantity<long,_kj::_::NanosecondLabel>)local_28.value;
  local_68.op.content.ptr = " != ";
  local_68.op.content.size_ = 5;
  if ((!local_68.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::DateLabel>,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::DateLabel>&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x11e,ERROR,
               "\"failed: expected \" \"file.stat().lastModified != time\", _kjCondition",
               (char (*) [50])"failed: expected file.stat().lastModified != time",&local_68);
  }
  return;
}

Assistant:

void expectUnchanged(const FsNode& file) {
    KJ_EXPECT(file.stat().lastModified != time);
  }